

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_mdef_gen.c
# Opt level: O0

int32 read_dict(char *dictfile,char *fillerdict,dicthashelement_t ***dicthash)

{
  uint uVar1;
  dicthashelement_t **hashtable;
  FILE *__stream;
  char *pcVar2;
  dicthashelement_t *pdVar3;
  char *__s;
  size_t sVar4;
  char **ppcVar5;
  FILE *dict;
  int local_80;
  int32 idict;
  int32 numdicts;
  int32 nphns;
  int32 vocabsiz;
  int32 maxphnlen;
  dicthashelement_t *sptr;
  dicthashelement_t **lhash;
  char *tphn;
  char *phone;
  char *word;
  char *dictword;
  lineiter_t *liter;
  char *dictfn [2];
  char *dictsent;
  dicthashelement_t ***dicthash_local;
  char *fillerdict_local;
  char *dictfile_local;
  
  dictword = (char *)0x0;
  numdicts = 0;
  local_80 = 1;
  if (fillerdict != (char *)0x0) {
    local_80 = 2;
    dictfn[0] = fillerdict;
  }
  hashtable = (dicthashelement_t **)calloc(0x2717,0x20);
  if (hashtable == (dicthashelement_t **)0x0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x114,"Unable to allocate space for dictionary\n");
    exit(1);
  }
  dict._4_4_ = 0;
  do {
    if (local_80 <= dict._4_4_) {
      *dicthash = hashtable;
      lineiter_free((lineiter_t *)dictword);
      return numdicts;
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x118,"Reading dict %s\n",dictfn[(long)dict._4_4_ + -1]);
    __stream = fopen(dictfn[(long)dict._4_4_ + -1],"r");
    if (__stream == (FILE *)0x0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                     ,0x11a,"Unable to open dictionary %s",dictfile);
      exit(1);
    }
    numdicts = 0;
    for (dictword = (char *)lineiter_start_clean((FILE *)__stream); dictword != (char *)0x0;
        dictword = (char *)lineiter_next((lineiter_t *)dictword)) {
      if (**(char **)dictword == '\0') {
        uVar1 = lineiter_lineno((lineiter_t *)dictword);
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                ,0x121,"Empty line %d in the dictionary file %s\n",(ulong)uVar1,
                dictfn[(long)dict._4_4_ + -1]);
      }
      else {
        dictfn[1] = strdup(*(char **)dictword);
        pcVar2 = strtok(dictfn[1]," \t\n");
        if (pcVar2 == (char *)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x127,"Empty line in dictionary!\n");
          exit(1);
        }
        pdVar3 = dictinstall(pcVar2,hashtable);
        if (pdVar3 == (dicthashelement_t *)0x0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x12a,"Unable to install dict word %s\n",pcVar2);
          exit(1);
        }
        if (pdVar3->nphns != 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x12d,"Duplicate entry for %s in dictionary\n",pcVar2);
          exit(1);
        }
        nphns = 0;
        idict = 0;
        while( true ) {
          __s = strtok((char *)0x0," \t\n");
          if (__s == (char *)0x0) break;
          sVar4 = strlen(__s);
          if ((ulong)(long)nphns < sVar4) {
            sVar4 = strlen(__s);
            nphns = (int32)sVar4;
          }
          idict = idict + 1;
        }
        if (idict == 0) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                  ,0x135,"Dictionary word %s has no pronunciation\n",pcVar2);
          exit(1);
        }
        pdVar3->nphns = idict;
        ppcVar5 = (char **)__ckd_calloc_2d__((long)idict,(long)(nphns + 1),1,
                                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
                                             ,0x137);
        pdVar3->phones = ppcVar5;
        strtok(*(char **)dictword," \t\n");
        idict = 0;
        while( true ) {
          pcVar2 = strtok((char *)0x0," \t\n");
          if (pcVar2 == (char *)0x0) break;
          strcpy(pdVar3->phones[idict],pcVar2);
          idict = idict + 1;
        }
        numdicts = numdicts + 1;
        free(dictfn[1]);
      }
    }
    fclose(__stream);
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/mk_mdef_gen/mk_mdef_gen.c"
            ,0x142,"%d words in dict %s\n",(ulong)(uint)numdicts,dictfn[(long)dict._4_4_ + -1]);
    dict._4_4_ = dict._4_4_ + 1;
  } while( true );
}

Assistant:

int32  read_dict(const char *dictfile, const char *fillerdict, 
		 dicthashelement_t ***dicthash)
{
    char *dictsent;
    const char *dictfn[2];
    lineiter_t *liter = NULL;
    char  *dictword, *word, *phone, *tphn;
    dicthashelement_t   **lhash, *sptr;
    int32  maxphnlen, vocabsiz=0, nphns, numdicts, idict;
    FILE   *dict;

    numdicts = 1;  dictfn[0] = dictfile;
    if (fillerdict != NULL){
        dictfn[1] = fillerdict; 
        numdicts = 2;
    }

    lhash = (dicthashelement_t**)calloc(DICTHASHSIZE,sizeof(dicthashelement_t));
    if (lhash == NULL) E_FATAL("Unable to allocate space for dictionary\n");

    /* Create hash table with dictionary words as entries */
    for (idict = 0; idict < numdicts; idict++){
	E_INFO("Reading dict %s\n",dictfn[idict]);
        if ((dict = fopen(dictfn[idict],"r")) == NULL)
            E_FATAL_SYSTEM("Unable to open dictionary %s", dictfile);

        vocabsiz = 0;
        for (liter = lineiter_start_clean(dict); liter; liter = lineiter_next(liter)) {

	    if (liter->buf[0] == 0) {
		E_WARN("Empty line %d in the dictionary file %s\n", 
			lineiter_lineno(liter), dictfn[idict]);
		continue;
	    }

	    dictsent = strdup(liter->buf);
            if ((dictword = strtok(dictsent, " \t\n")) == NULL)
                E_FATAL("Empty line in dictionary!\n");

            if ((sptr = dictinstall(dictword,lhash)) == NULL)
                E_FATAL("Unable to install dict word %s\n",dictword);

            if (sptr->nphns != 0)
                E_FATAL("Duplicate entry for %s in dictionary\n",dictword);

            /* Count number of phones in pronunciation */
	    maxphnlen = 0;
            for(nphns=0; (tphn=strtok(NULL," \t\n")) != NULL; nphns++){
	        if (strlen(tphn) > maxphnlen) maxphnlen = strlen(tphn);
            }
	    if (nphns == 0)
	        E_FATAL("Dictionary word %s has no pronunciation\n",dictword);
            sptr->nphns = nphns; maxphnlen++;
            sptr->phones = (char**)ckd_calloc_2d(nphns,maxphnlen,sizeof(char));

            word = strtok(liter->buf," \t\n");
            for(nphns=0;(phone = strtok(NULL," \t\n")) != NULL;nphns++)
	        strcpy(sptr->phones[nphns],phone);
	
            ++vocabsiz;
            
            free(dictsent);
        }
        fclose(dict);
        E_INFO("%d words in dict %s\n", vocabsiz, dictfn[idict]);
    }

    *dicthash = lhash;

    lineiter_free(liter);
    return(vocabsiz);
}